

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O3

void __thiscall kratos::PortVisitor::visit(PortVisitor *this,Port *port)

{
  shared_ptr<kratos::Port> sVar1;
  pointer local_20;
  
  sVar1 = Var::as<kratos::Port>((Var *)&stack0xffffffffffffffd8);
  std::
  _Hashtable<std::shared_ptr<kratos::Port>,std::shared_ptr<kratos::Port>,std::allocator<std::shared_ptr<kratos::Port>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Port>>,std::hash<std::shared_ptr<kratos::Port>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Port>>
            ((_Hashtable<std::shared_ptr<kratos::Port>,std::shared_ptr<kratos::Port>,std::allocator<std::shared_ptr<kratos::Port>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Port>>,std::hash<std::shared_ptr<kratos::Port>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->ports,(Var *)&stack0xffffffffffffffd8,
             sVar1.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  if (local_20 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return;
}

Assistant:

void visit(Port* port) override { ports.emplace(port->as<Port>()); }